

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O2

Expression *
slang::ast::NewCovergroupExpression::fromSyntax
          (Compilation *compilation,NewClassExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  ArgumentListSyntax *argSyntax;
  bool bVar1;
  int iVar2;
  CovergroupType *this;
  undefined4 extraout_var;
  NewCovergroupExpression *pNVar3;
  EVP_PKEY_CTX *src;
  ArgList formalArgs;
  string_view symbolName;
  SourceRange range;
  SmallVector<const_slang::ast::Expression_*,_5UL> args;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_30;
  
  range = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  this = (CovergroupType *)Type::getCanonicalType(assignmentTarget);
  args.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
       (pointer)args.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement;
  args.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
  args.super_SmallVectorBase<const_slang::ast::Expression_*>.cap = 5;
  argSyntax = syntax->argList;
  formalArgs = CovergroupType::getArguments(this);
  symbolName._M_str = "new";
  symbolName._M_len = 3;
  bVar1 = CallExpression::bindArgs
                    (argSyntax,formalArgs,symbolName,range,context,
                     &args.super_SmallVectorBase<const_slang::ast::Expression_*>,false);
  if (bVar1) {
    iVar2 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                      (&args.super_SmallVectorBase<const_slang::ast::Expression_*>,
                       (EVP_PKEY_CTX *)compilation,src);
    local_30._M_ptr = (pointer)CONCAT44(extraout_var,iVar2);
    pNVar3 = BumpAllocator::
             emplace<slang::ast::NewCovergroupExpression,slang::ast::Type_const&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
                       (&compilation->super_BumpAllocator,assignmentTarget,&local_30,&range);
  }
  else {
    assignmentTarget = (Type *)0x0;
    pNVar3 = (NewCovergroupExpression *)Expression::badExpr(compilation,(Expression *)0x0);
  }
  SmallVectorBase<const_slang::ast::Expression_*>::cleanup
            (&args.super_SmallVectorBase<const_slang::ast::Expression_*>,
             (EVP_PKEY_CTX *)assignmentTarget);
  return &pNVar3->super_Expression;
}

Assistant:

Expression& NewCovergroupExpression::fromSyntax(Compilation& compilation,
                                                const NewClassExpressionSyntax& syntax,
                                                const ASTContext& context,
                                                const Type& assignmentTarget) {
    auto range = syntax.sourceRange();
    auto& coverType = assignmentTarget.getCanonicalType().as<CovergroupType>();

    SmallVector<const Expression*> args;
    if (!CallExpression::bindArgs(syntax.argList, coverType.getArguments(), "new"sv, range, context,
                                  args, /* isBuiltInMethod */ false)) {
        return badExpr(compilation, nullptr);
    }

    return *compilation.emplace<NewCovergroupExpression>(assignmentTarget, args.copy(compilation),
                                                         range);
}